

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderMaxPatchVertices::initProgramObjects
          (TessellationShaderMaxPatchVertices *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  uint uVar5;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar6;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id_1 = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x22d);
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id_2 = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x230);
  (**(code **)(lVar6 + 0x700))(1,&this->m_tf_id_1);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGenTransformFeedbacks() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x234);
  (**(code **)(lVar6 + 0x700))(1,&this->m_tf_id_2);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGenTransformFeedbacks() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x237);
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader(VERTEX_SHADER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x23b);
  GVar3 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER)
  ;
  this->m_tc_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x23e);
  GVar3 = (**(code **)(lVar6 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_te_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x241);
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x244);
  (**(code **)(lVar6 + 0xd0))(0x8e22,this->m_tf_id_1);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glBindTransformFeedback() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x248);
  (**(code **)(lVar6 + 0x14c8))(this->m_po_id_1,2,m_tf_varyings,0x8c8d);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x24b);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id_1,this->m_vs_id,1,&m_vs_code,
                     this->m_tc_id,1,&m_tc_code,this->m_te_id,1,&m_te_code,this->m_fs_id,1,
                     &m_fs_code,(bool *)0x0);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program linking failed!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
               ,0x251);
LAB_00d380f5:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar5 & 0x300) != 0) {
    (**(code **)(lVar6 + 0xd0))(0x8e22,this->m_tf_id_2);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glBindTransformFeedback() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,600);
    (**(code **)(lVar6 + 0x14c8))(this->m_po_id_2,2,m_tf_varyings,0x8c8d);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glTransformFeedbackVaryings() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x25b);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id_2,this->m_vs_id,1,&m_vs_code,
                       this->m_te_id,1,&m_te_code,this->m_fs_id,1,&m_fs_code,(bool *)0x0);
    if (!bVar1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Program linking failed!",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                 ,0x260);
      goto LAB_00d380f5;
    }
  }
  return;
}

Assistant:

void TessellationShaderMaxPatchVertices::initProgramObjects(void)
{
	/* Retrieve ES entry/state points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create and configure shader objects. */
	m_po_id_1 = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed!");

	m_po_id_2 = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed!");

	/* Creating Transform Feedback objects. */
	gl.genTransformFeedbacks(1, &m_tf_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks() failed!");

	gl.genTransformFeedbacks(1, &m_tf_id_2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks() failed!");

	/* Create and configure shader objects. */
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(VERTEX_SHADER) failed!");

	m_tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed!");

	m_te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed!");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed!");

	/* Transform Feedback setup case 1 (explicit arrays).*/
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

	gl.transformFeedbackVaryings(m_po_id_1, 2 /* count */, m_tf_varyings, GL_SEPARATE_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed!");

	/* Build the program object case 1 (explicit arrays).*/
	if (!buildProgram(m_po_id_1, m_vs_id, 1, &m_vs_code, m_tc_id, 1, &m_tc_code, m_te_id, 1, &m_te_code, m_fs_id, 1,
					  &m_fs_code))
	{
		TCU_FAIL("Program linking failed!");
	}

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Transform Feedback setup case 2 (implicit arrays).*/
		gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

		gl.transformFeedbackVaryings(m_po_id_2, 2 /* count */, m_tf_varyings, GL_SEPARATE_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed!");

		/* Build the program object case 2 (implicit arrays). */
		if (!buildProgram(m_po_id_2, m_vs_id, 1, &m_vs_code, m_te_id, 1, &m_te_code, m_fs_id, 1, &m_fs_code))
		{
			TCU_FAIL("Program linking failed!");
		}
	}
}